

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O0

void __thiscall
vkt::QueryPool::anon_unknown_0::GeometryShaderTestInstance::draw
          (GeometryShaderTestInstance *this,VkCommandBuffer cmdBuffer)

{
  DeviceInterface *pDVar1;
  DeviceInterface *vk;
  VkCommandBuffer cmdBuffer_local;
  GeometryShaderTestInstance *this_local;
  
  pDVar1 = Context::getDeviceInterface
                     ((this->super_GraphicBasicTestInstance).super_StatisticQueryTestInstance.
                      super_TestInstance.m_context);
  if ((((this->super_GraphicBasicTestInstance).m_parametersGraphic)->primitiveTopology ==
       VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP) ||
     (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->primitiveTopology ==
      VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST)) {
    (*pDVar1->_vptr_DeviceInterface[0x59])(pDVar1,cmdBuffer,3,1,0);
    (*pDVar1->_vptr_DeviceInterface[0x59])(pDVar1,cmdBuffer,3,1,4);
    (*pDVar1->_vptr_DeviceInterface[0x59])(pDVar1,cmdBuffer,3,1,8,2);
    (*pDVar1->_vptr_DeviceInterface[0x59])(pDVar1,cmdBuffer,3,1,0xc);
  }
  else {
    (*pDVar1->_vptr_DeviceInterface[0x59])(pDVar1,cmdBuffer,0x10,1,0);
  }
  return;
}

Assistant:

void GeometryShaderTestInstance::draw (VkCommandBuffer cmdBuffer)
{
	const DeviceInterface&	vk			= m_context.getDeviceInterface();
	if (m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP ||
		m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST)
	{
		vk.cmdDraw(cmdBuffer, 3u, 1u,  0u,  1u);
		vk.cmdDraw(cmdBuffer, 3u, 1u,  4u,  1u);
		vk.cmdDraw(cmdBuffer, 3u, 1u,  8u,  2u);
		vk.cmdDraw(cmdBuffer, 3u, 1u, 12u,  3u);
	}
	else
	{
		vk.cmdDraw(cmdBuffer, 16u, 1u, 0u,  0u);
	}
}